

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.cc
# Opt level: O1

bool testing::internal::ParseGoogleMockFlag(char *str,char *flag_name,int32_t *value)

{
  bool bVar1;
  char *str_00;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  
  str_00 = ParseGoogleMockFlagValue(str,"default_mock_behavior",true);
  if (str_00 == (char *)0x0) {
    bVar1 = false;
  }
  else {
    Message::Message((Message *)&local_20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_20._M_head_impl + 0x10),"The value of flag --",0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_20._M_head_impl + 0x10),"default_mock_behavior",0x15);
    bVar1 = ParseInt32((Message *)&local_20,str_00,(int32_t *)flag_name);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  return bVar1;
}

Assistant:

static bool ParseGoogleMockFlag(const char* str, const char* flag_name,
                                int32_t* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseGoogleMockFlagValue(str, flag_name, true);

  // Aborts if the parsing failed.
  if (value_str == nullptr) return false;

  // Sets *value to the value of the flag.
  return ParseInt32(Message() << "The value of flag --" << flag_name, value_str,
                    value);
}